

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

void __thiscall Box::init_normals(Box *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  
  dVar1 = (this->loc).x;
  dVar2 = (this->loc).y;
  dVar3 = (this->e3).x;
  dVar7 = (this->e1).z;
  dVar8 = (this->e2).x;
  dVar9 = (this->e2).y;
  dVar10 = (this->e2).z;
  dVar4 = (this->e1).y;
  dVar11 = (this->e3).y;
  dVar12 = (this->e3).z;
  auVar26._0_8_ = dVar4 * dVar10 - dVar7 * dVar9;
  auVar26._8_8_ = dVar4 * dVar12 - dVar7 * dVar11;
  dVar5 = (this->e1).x;
  auVar16._0_8_ = dVar7 * dVar8 - dVar10 * dVar5;
  auVar16._8_8_ = dVar3 * dVar7 - dVar12 * dVar5;
  auVar21._0_8_ = dVar9 * dVar5 - dVar8 * dVar4;
  auVar21._8_8_ = dVar11 * dVar5 - dVar3 * dVar4;
  auVar27._0_8_ = auVar26._0_8_ * auVar26._0_8_ + auVar16._0_8_ * auVar16._0_8_;
  auVar27._8_8_ = auVar26._8_8_ * auVar26._8_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar17._8_8_ = auVar21._8_8_ * auVar21._8_8_ + auVar27._8_8_;
  auVar17._0_8_ = auVar21._0_8_ * auVar21._0_8_ + auVar27._0_8_;
  auVar19 = sqrtpd(auVar27,auVar17);
  auVar27 = divpd(auVar26,auVar19);
  auVar17 = divpd(auVar16,auVar19);
  dVar25 = auVar27._0_8_;
  dVar15 = auVar17._0_8_;
  dVar6 = (this->loc).z;
  this->n[0].x = dVar25;
  this->n[0].y = dVar15;
  auVar19 = divpd(auVar21,auVar19);
  dVar28 = auVar27._8_8_;
  dVar20 = auVar19._0_8_;
  this->n[0].z = dVar20;
  this->n[1].x = dVar28;
  dVar18 = auVar17._8_8_;
  dVar22 = auVar19._8_8_;
  this->n[1].y = dVar18;
  this->n[1].z = dVar22;
  this->d1[0] = -(dVar20 * dVar6 + dVar25 * dVar1 + dVar2 * dVar15);
  this->d1[1] = -(dVar22 * dVar6 + dVar28 * dVar1 + dVar2 * dVar18);
  auVar29._0_8_ = dVar12 * dVar9 - dVar10 * dVar11;
  auVar29._8_8_ = dVar3 * dVar10 - dVar8 * dVar12;
  dVar24 = dVar8 * dVar11 - dVar3 * dVar9;
  dVar23 = SQRT(dVar24 * dVar24 + auVar29._0_8_ * auVar29._0_8_ + auVar29._8_8_ * auVar29._8_8_);
  dVar24 = dVar24 / dVar23;
  auVar19._8_8_ = dVar23;
  auVar19._0_8_ = dVar23;
  auVar17 = divpd(auVar29,auVar19);
  this->n[2].x = (double)auVar17._0_8_;
  this->n[2].y = (double)auVar17._8_8_;
  this->n[2].z = dVar24;
  this->d1[2] = -(dVar6 * dVar24 + dVar1 * auVar17._0_8_ + auVar17._8_8_ * dVar2);
  this->d2[0] = -(dVar20 * (dVar12 + dVar6) + dVar25 * (dVar1 + dVar3) + (dVar2 + dVar11) * dVar15);
  this->d2[1] = -(dVar22 * (dVar10 + dVar6) + dVar28 * (dVar8 + dVar1) + dVar18 * (dVar9 + dVar2));
  this->d2[2] = -(dVar24 * (dVar7 + dVar6) +
                 auVar17._0_8_ * (dVar5 + dVar1) + auVar17._8_8_ * (dVar4 + dVar2));
  pdVar13 = &this->n[0].z;
  lVar14 = -0x18;
  do {
    dVar1 = *(double *)((long)this->d2 + lVar14);
    dVar2 = *(double *)((long)this->d2 + lVar14 + 0x18);
    if (dVar2 < dVar1) {
      *(double *)((long)this->d2 + lVar14) = -dVar1;
      *(double *)((long)this->d2 + lVar14 + 0x18) = -dVar2;
      dVar1 = *pdVar13;
      dVar2 = pdVar13[-1];
      ((Vector *)(pdVar13 + -2))->x = -((Vector *)(pdVar13 + -2))->x;
      pdVar13[-1] = -dVar2;
      *pdVar13 = -dVar1;
    }
    pdVar13 = pdVar13 + 3;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0);
  return;
}

Assistant:

double operator & ( const Vector& u,const Vector& v ) {
        return u.x*v.x + u.y*v.y + u.z*v.z;
    }